

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

int ebur128_true_peak(ebur128_state *st,uint channel_number,double *out)

{
  double *pdVar1;
  double dVar2;
  double local_30;
  double *out_local;
  uint channel_number_local;
  ebur128_state *st_local;
  
  if ((st->mode & 0x31U) == 0x31) {
    if (channel_number < st->channels) {
      dVar2 = st->d->true_peak[channel_number];
      pdVar1 = st->d->sample_peak + channel_number;
      if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
        local_30 = st->d->sample_peak[channel_number];
      }
      else {
        local_30 = st->d->true_peak[channel_number];
      }
      *out = local_30;
      st_local._4_4_ = 0;
    }
    else {
      st_local._4_4_ = 3;
    }
  }
  else {
    st_local._4_4_ = 2;
  }
  return st_local._4_4_;
}

Assistant:

int ebur128_true_peak(ebur128_state* st,
                      unsigned int channel_number,
                      double* out) {
  if ((st->mode & EBUR128_MODE_TRUE_PEAK) != EBUR128_MODE_TRUE_PEAK) {
    return EBUR128_ERROR_INVALID_MODE;
  }

  if (channel_number >= st->channels) {
    return EBUR128_ERROR_INVALID_CHANNEL_INDEX;
  }

  *out = EBUR128_MAX(st->d->true_peak[channel_number],
                     st->d->sample_peak[channel_number]);
  return EBUR128_SUCCESS;
}